

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O2

void __thiscall KosarajuSCC::run(KosarajuSCC *this)

{
  int iVar1;
  bool *visited;
  _Elt_pointer piVar2;
  int iVar3;
  int i;
  long lVar4;
  allocator_type local_91;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_90;
  value_type_conflict1 local_84;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  
  local_84 = -1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&s,(long)this->nb_nodes,&local_84,&local_91);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->scc);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&s);
  local_90 = &this->sccs;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(local_90);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>(&s);
  iVar1 = this->nb_nodes;
  iVar3 = -1;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  visited = (bool *)operator_new__((long)iVar3);
  memset(visited,0,(long)iVar1);
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    if (visited[lVar4] == false) {
      iVar1 = (*this->_vptr_KosarajuSCC[3])(this);
      if ((char)iVar1 == '\0') {
        fillOrder(this,(int)lVar4,visited,&s);
      }
    }
    iVar1 = this->nb_nodes;
  }
  iVar3 = 0;
  memset(visited,0,(long)iVar1);
  while (s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
         _M_cur != s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                   _M_start._M_cur) {
    piVar2 = s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    if (s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
        _M_cur == s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_finish._M_first) {
      piVar2 = s.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
               _M_finish._M_node[-1] + 0x80;
    }
    iVar1 = piVar2[-1];
    std::deque<int,_std::allocator<int>_>::pop_back(&s.c);
    if (visited[iVar1] == false) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::emplace_back<>(local_90);
      DFS(this,iVar1,visited,iVar3);
      iVar3 = iVar3 + 1;
    }
  }
  operator_delete__(visited);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&s);
  return;
}

Assistant:

void KosarajuSCC::run() {
	scc = std::vector<int>(nb_nodes, -1);
	sccs.clear();
	std::stack<int> s;

	// Mark all the vertices as not visited (For first DFS)
	bool* visited = new bool[nb_nodes];
	memset(visited, 0, nb_nodes * sizeof(bool));
	// Fill vertices in stack according to their finishing times
	for (int i = 0; i < nb_nodes; i++) {
		if (visited[i] == false && !ignore_node(i)) {
			fillOrder(i, visited, s);
		}
	}

	// Mark all the vertices as not visited (For second DFS)
	memset(visited, 0, nb_nodes * sizeof(bool));

	// Now process all vertices in order defined by Stack
	int curr = 0;
	while (!s.empty()) {
		// Pop a vertex from stack
		const int v = s.top();
		s.pop();

		// Print Strongly connected component of the popped vertex
		if (visited[v] == false) {
			sccs.emplace_back();
			DFS(v, visited, curr);
			curr++;
		}
	}
	delete[] visited;
}